

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O2

void __thiscall
cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen
          (cmQtAutoGenGlobalInitializer *this,cmLocalGenerator *localGen,string *targetName)

{
  iterator iVar1;
  cmGeneratorTarget *pcVar2;
  cmLocalGenerator *local_18;
  
  local_18 = localGen;
  iVar1 = std::
          _Rb_tree<cmLocalGenerator_*,_std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<cmLocalGenerator_*>,_std::allocator<std::pair<cmLocalGenerator_*const,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::find(&(this->GlobalAutoGenTargets_)._M_t,&local_18);
  if ((_Rb_tree_header *)iVar1._M_node !=
      &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header) {
    pcVar2 = cmLocalGenerator::FindGeneratorTargetToUse
                       (local_18,(string *)&iVar1._M_node[1]._M_parent);
    if (pcVar2 != (cmGeneratorTarget *)0x0) {
      cmTarget::AddUtility(pcVar2->Target,targetName,local_18->Makefile);
    }
  }
  return;
}

Assistant:

void cmQtAutoGenGlobalInitializer::AddToGlobalAutoGen(
  cmLocalGenerator* localGen, std::string const& targetName)
{
  auto it = GlobalAutoGenTargets_.find(localGen);
  if (it != GlobalAutoGenTargets_.end()) {
    cmGeneratorTarget* target = localGen->FindGeneratorTargetToUse(it->second);
    if (target != nullptr) {
      target->Target->AddUtility(targetName, localGen->GetMakefile());
    }
  }
}